

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O1

bool __thiscall QMYSQLResult::fetchNext(QMYSQLResult *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  QSqlError local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar4 = QSqlResult::driver();
  if (lVar4 != 0) {
    if (*(char *)(lVar1 + 0xfd) == '\x01') {
      iVar3 = mysql_stmt_fetch(*(undefined8 *)(lVar1 + 0xd8));
      if (iVar3 == 0) {
LAB_00109e75:
        iVar3 = QSqlResult::at();
        (**(code **)(*(long *)this + 0x18))(this,iVar3 + 1);
        bVar2 = true;
        goto LAB_00109e8f;
      }
      if ((iVar3 == 0x65) || (iVar3 == 1)) {
        QCoreApplication::translate((char *)local_40,"QMYSQLResult","Unable to fetch data",0);
        qMakeStmtError((QString *)local_28,(ErrorType)local_40,*(MYSQL_STMT **)(lVar1 + 0xd8));
        (**(code **)(*(long *)this + 0x28))(this,local_28);
        QSqlError::~QSqlError(local_28);
        if (local_40[0] != (QArrayData *)0x0) {
          LOCK();
          (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40[0],2,0x10);
          }
        }
      }
    }
    else {
      lVar4 = mysql_fetch_row(*(undefined8 *)(lVar1 + 0xb0));
      *(long *)(lVar1 + 0xb8) = lVar4;
      if (lVar4 != 0) goto LAB_00109e75;
    }
  }
  bVar2 = false;
LAB_00109e8f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMYSQLResult::fetchNext()
{
    Q_D(QMYSQLResult);
    if (!driver())
        return false;
    if (d->preparedQuery) {
        int nRC = mysql_stmt_fetch(d->stmt);
        if (nRC) {
            if (nRC == 1 || nRC == MYSQL_DATA_TRUNCATED)
                setLastError(qMakeStmtError(QCoreApplication::translate("QMYSQLResult",
                                    "Unable to fetch data"), QSqlError::StatementError, d->stmt));
            return false;
        }
    } else {
        d->row = mysql_fetch_row(d->result);
        if (!d->row)
            return false;
    }
    setAt(at() + 1);
    return true;
}